

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O0

uint __thiscall
llvm::DWARFVerifier::verifyDebugInfoForm
          (DWARFVerifier *this,DWARFDie *Die,DWARFAttribute *AttrValue)

{
  DIDumpOptions *pDVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  DWARFObject *pDVar7;
  DWARFUnit *this_00;
  uint64_t uVar8;
  mapped_type *pmVar9;
  StringRef *this_01;
  undefined4 extraout_var;
  Optional *this_02;
  raw_ostream *prVar10;
  uint64_t uVar11;
  undefined4 extraout_var_00;
  size_t sVar12;
  unsigned_long *puVar13;
  undefined4 extraout_var_01;
  Optional<unsigned_long> OVar14;
  format_object<unsigned_long> local_1b8;
  StringRef local_1a0;
  StringRef local_190;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_180;
  undefined1 local_178;
  ulong local_170;
  uint64_t StringOffset;
  StringRef local_150;
  long local_140;
  uint64_t Offset;
  undefined1 auStack_130 [4];
  uint ItemSize;
  DWARFUnit *local_120;
  DWARFUnit *DieCU_1;
  uint64_t Index;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_100;
  Optional<unsigned_long> SecOffset;
  uint64_t local_e0;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_d8;
  Optional<unsigned_long> RefVal_1;
  uint64_t local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  format_object<unsigned_long> local_98;
  format_object<unsigned_long> local_80;
  StringRef local_68;
  uint64_t local_58;
  uint64_t CUOffset;
  uint64_t CUSize;
  Optional<unsigned_long> RefVal;
  Form Form;
  uint NumErrors;
  DWARFUnit *DieCU;
  DWARFObject *DObj;
  DWARFAttribute *AttrValue_local;
  DWARFDie *Die_local;
  DWARFVerifier *this_local;
  
  pDVar7 = DWARFContext::getDWARFObj(this->DCtx);
  this_00 = DWARFDie::getDwarfUnit(Die);
  RefVal.Storage._12_4_ = 0;
  RefVal.Storage._10_2_ = DWARFFormValue::getForm(&AttrValue->Value);
  switch(RefVal.Storage._10_2_) {
  case (BADTYPE)0xe:
    OVar14 = DWARFFormValue::getAsSectionOffset(&AttrValue->Value);
    local_100 = OVar14.Storage.field_0;
    SecOffset.Storage.field_0.empty = OVar14.Storage.hasVal;
    bVar4 = llvm::Optional::operator_cast_to_bool((Optional *)&local_100.empty);
    if (!bVar4) {
      __assert_fail("SecOffset",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFVerifier.cpp"
                    ,0x249,
                    "unsigned int llvm::DWARFVerifier::verifyDebugInfoForm(const DWARFDie &, DWARFAttribute &)"
                   );
    }
    bVar3 = llvm::Optional::operator_cast_to_bool((Optional *)&local_100.empty);
    bVar4 = false;
    if (bVar3) {
      puVar13 = Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&local_100);
      uVar2 = *puVar13;
      iVar6 = (*pDVar7->_vptr_DWARFObject[0x11])();
      Index = CONCAT44(extraout_var,iVar6);
      sVar12 = StringRef::size((StringRef *)&Index);
      bVar4 = sVar12 <= uVar2;
    }
    if (bVar4) {
      RefVal.Storage._12_4_ = RefVal.Storage._12_4_ + 1;
      prVar10 = error(this);
      raw_ostream::operator<<(prVar10,"DW_FORM_strp offset beyond .debug_str bounds:\n");
      prVar10 = dump(this,Die,0);
      raw_ostream::operator<<(prVar10,'\n');
    }
    break;
  default:
    break;
  case (BADTYPE)0x10:
    OVar14 = DWARFFormValue::getAsReference(&AttrValue->Value);
    local_d8 = OVar14.Storage.field_0;
    RefVal_1.Storage.field_0.empty = OVar14.Storage.hasVal;
    bVar4 = llvm::Optional::operator_cast_to_bool((Optional *)&local_d8.empty);
    if (!bVar4) {
      __assert_fail("RefVal",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFVerifier.cpp"
                    ,0x238,
                    "unsigned int llvm::DWARFVerifier::verifyDebugInfoForm(const DWARFDie &, DWARFAttribute &)"
                   );
    }
    bVar4 = llvm::Optional::operator_cast_to_bool((Optional *)&local_d8.empty);
    if (bVar4) {
      puVar13 = Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&local_d8);
      uVar2 = *puVar13;
      this_01 = &DWARFUnit::getInfoSection(this_00)->Data;
      sVar12 = StringRef::size(this_01);
      if (uVar2 < sVar12) {
        puVar13 = Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&local_d8);
        pmVar9 = std::
                 map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                 ::operator[](&this->ReferenceToDIEOffsets,puVar13);
        local_e0 = DWARFDie::getOffset(Die);
        std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
                  (pmVar9,&local_e0);
      }
      else {
        RefVal.Storage._12_4_ = RefVal.Storage._12_4_ + 1;
        prVar10 = error(this);
        raw_ostream::operator<<(prVar10,"DW_FORM_ref_addr offset beyond .debug_info bounds:\n");
        prVar10 = dump(this,Die,0);
        raw_ostream::operator<<(prVar10,'\n');
      }
    }
    break;
  case (BADTYPE)0x11:
  case (BADTYPE)0x12:
  case (BADTYPE)0x13:
  case (BADTYPE)0x14:
  case (BADTYPE)0x15:
    OVar14 = DWARFFormValue::getAsReference(&AttrValue->Value);
    CUSize = (uint64_t)OVar14.Storage.field_0;
    RefVal.Storage.field_0.empty = OVar14.Storage.hasVal;
    bVar4 = llvm::Optional::operator_cast_to_bool((Optional *)&CUSize);
    if (!bVar4) {
      __assert_fail("RefVal",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFVerifier.cpp"
                    ,0x220,
                    "unsigned int llvm::DWARFVerifier::verifyDebugInfoForm(const DWARFDie &, DWARFAttribute &)"
                   );
    }
    bVar4 = llvm::Optional::operator_cast_to_bool((Optional *)&CUSize);
    if (bVar4) {
      uVar11 = DWARFUnit::getNextUnitOffset(this_00);
      uVar8 = DWARFUnit::getOffset(this_00);
      CUOffset = uVar11 - uVar8;
      local_58 = DWARFFormValue::getRawUValue(&AttrValue->Value);
      if (local_58 < CUOffset) {
        puVar13 = Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&CUSize);
        pmVar9 = std::
                 map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                 ::operator[](&this->ReferenceToDIEOffsets,puVar13);
        local_b8 = DWARFDie::getOffset(Die);
        std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
                  (pmVar9,&local_b8);
      }
      else {
        RefVal.Storage._12_4_ = RefVal.Storage._12_4_ + 1;
        prVar10 = error(this);
        local_68 = dwarf::FormEncodingString((uint)(ushort)RefVal.Storage._10_2_);
        prVar10 = raw_ostream::operator<<(prVar10,local_68);
        prVar10 = raw_ostream::operator<<(prVar10," CU offset ");
        format<unsigned_long>(&local_80,"0x%08lx",&local_58);
        prVar10 = raw_ostream::operator<<(prVar10,&local_80.super_format_object_base);
        prVar10 = raw_ostream::operator<<(prVar10," is invalid (must be less than CU size of ");
        format<unsigned_long>(&local_98,"0x%08lx",&CUOffset);
        prVar10 = raw_ostream::operator<<(prVar10,&local_98.super_format_object_base);
        raw_ostream::operator<<(prVar10,"):\n");
        pDVar1 = &this->DumpOpts;
        local_b0._0_4_ = pDVar1->DumpType;
        local_b0._4_4_ = pDVar1->ChildRecurseDepth;
        local_a8._0_4_ = (this->DumpOpts).ParentRecurseDepth;
        local_a8._4_2_ = (this->DumpOpts).Version;
        local_a8._6_1_ = (this->DumpOpts).AddrSize;
        local_a8._7_1_ = (this->DumpOpts).ShowAddresses;
        local_a0._0_1_ = (this->DumpOpts).ShowChildren;
        local_a0._1_1_ = (this->DumpOpts).ShowParents;
        local_a0._2_1_ = (this->DumpOpts).ShowForm;
        local_a0._3_1_ = (this->DumpOpts).SummarizeTypes;
        local_a0._4_1_ = (this->DumpOpts).Verbose;
        local_a0._5_1_ = (this->DumpOpts).DisplayRawContents;
        local_a0._6_2_ = *(undefined2 *)&(this->DumpOpts).field_0x16;
        DWARFDie::dump(Die,this->OS,0,*pDVar1);
        prVar10 = dump(this,Die,0);
        raw_ostream::operator<<(prVar10,'\n');
      }
    }
    break;
  case (BADTYPE)0x1a:
  case (BADTYPE)0x25:
  case (BADTYPE)0x26:
  case (BADTYPE)0x27:
  case (BADTYPE)0x28:
    DieCU_1 = (DWARFUnit *)DWARFFormValue::getRawUValue(&AttrValue->Value);
    local_120 = DWARFDie::getDwarfUnit(Die);
    this_02 = (Optional *)DWARFUnit::getStringOffsetsTableContribution(local_120);
    bVar4 = llvm::Optional::operator_cast_to_bool(this_02);
    if (bVar4) {
      bVar5 = DWARFUnit::getDwarfStringOffsetsByteSize(local_120);
      Offset._4_4_ = (uint)bVar5;
      uVar11 = DWARFUnit::getStringOffsetsBase(local_120);
      local_140 = uVar11 + (long)DieCU_1 * (ulong)Offset._4_4_;
      iVar6 = (*pDVar7->_vptr_DWARFObject[0x19])();
      sVar12 = StringRef::size((StringRef *)CONCAT44(extraout_var_00,iVar6));
      if (sVar12 < local_140 + (ulong)Offset._4_4_) {
        RefVal.Storage._12_4_ = RefVal.Storage._12_4_ + 1;
        prVar10 = error(this);
        local_150 = dwarf::FormEncodingString((uint)(ushort)RefVal.Storage._10_2_);
        prVar10 = raw_ostream::operator<<(prVar10,local_150);
        prVar10 = raw_ostream::operator<<(prVar10," uses index ");
        format<unsigned_long>
                  ((format_object<unsigned_long> *)&StringOffset,"%lu",(unsigned_long *)&DieCU_1);
        prVar10 = raw_ostream::operator<<(prVar10,(format_object_base *)&StringOffset);
        raw_ostream::operator<<(prVar10,", which is too large:\n");
        prVar10 = dump(this,Die,0);
        raw_ostream::operator<<(prVar10,'\n');
      }
      else {
        OVar14 = DWARFUnit::getStringOffsetSectionItem(local_120,(uint32_t)DieCU_1);
        local_180 = OVar14.Storage.field_0;
        local_178 = OVar14.Storage.hasVal;
        puVar13 = Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&local_180);
        uVar2 = *puVar13;
        local_170 = uVar2;
        iVar6 = (*pDVar7->_vptr_DWARFObject[0x11])();
        local_190.Data = (char *)CONCAT44(extraout_var_01,iVar6);
        sVar12 = StringRef::size(&local_190);
        if (sVar12 <= uVar2) {
          RefVal.Storage._12_4_ = RefVal.Storage._12_4_ + 1;
          prVar10 = error(this);
          local_1a0 = dwarf::FormEncodingString((uint)(ushort)RefVal.Storage._10_2_);
          prVar10 = raw_ostream::operator<<(prVar10,local_1a0);
          prVar10 = raw_ostream::operator<<(prVar10," uses index ");
          format<unsigned_long>(&local_1b8,"%lu",(unsigned_long *)&DieCU_1);
          prVar10 = raw_ostream::operator<<(prVar10,&local_1b8.super_format_object_base);
          raw_ostream::operator<<
                    (prVar10,", but the referenced string offset is beyond .debug_str bounds:\n");
          prVar10 = dump(this,Die,0);
          raw_ostream::operator<<(prVar10,'\n');
        }
      }
    }
    else {
      RefVal.Storage._12_4_ = RefVal.Storage._12_4_ + 1;
      prVar10 = error(this);
      _auStack_130 = dwarf::FormEncodingString((uint)(ushort)RefVal.Storage._10_2_);
      prVar10 = raw_ostream::operator<<(prVar10,_auStack_130);
      raw_ostream::operator<<(prVar10," used without a valid string offsets table:\n");
      prVar10 = dump(this,Die,0);
      raw_ostream::operator<<(prVar10,'\n');
    }
  }
  return RefVal.Storage._12_4_;
}

Assistant:

unsigned DWARFVerifier::verifyDebugInfoForm(const DWARFDie &Die,
                                            DWARFAttribute &AttrValue) {
  const DWARFObject &DObj = DCtx.getDWARFObj();
  auto DieCU = Die.getDwarfUnit();
  unsigned NumErrors = 0;
  const auto Form = AttrValue.Value.getForm();
  switch (Form) {
  case DW_FORM_ref1:
  case DW_FORM_ref2:
  case DW_FORM_ref4:
  case DW_FORM_ref8:
  case DW_FORM_ref_udata: {
    // Verify all CU relative references are valid CU offsets.
    Optional<uint64_t> RefVal = AttrValue.Value.getAsReference();
    assert(RefVal);
    if (RefVal) {
      auto CUSize = DieCU->getNextUnitOffset() - DieCU->getOffset();
      auto CUOffset = AttrValue.Value.getRawUValue();
      if (CUOffset >= CUSize) {
        ++NumErrors;
        error() << FormEncodingString(Form) << " CU offset "
                << format("0x%08" PRIx64, CUOffset)
                << " is invalid (must be less than CU size of "
                << format("0x%08" PRIx64, CUSize) << "):\n";
        Die.dump(OS, 0, DumpOpts);
        dump(Die) << '\n';
      } else {
        // Valid reference, but we will verify it points to an actual
        // DIE later.
        ReferenceToDIEOffsets[*RefVal].insert(Die.getOffset());
      }
    }
    break;
  }
  case DW_FORM_ref_addr: {
    // Verify all absolute DIE references have valid offsets in the
    // .debug_info section.
    Optional<uint64_t> RefVal = AttrValue.Value.getAsReference();
    assert(RefVal);
    if (RefVal) {
      if (*RefVal >= DieCU->getInfoSection().Data.size()) {
        ++NumErrors;
        error() << "DW_FORM_ref_addr offset beyond .debug_info "
                   "bounds:\n";
        dump(Die) << '\n';
      } else {
        // Valid reference, but we will verify it points to an actual
        // DIE later.
        ReferenceToDIEOffsets[*RefVal].insert(Die.getOffset());
      }
    }
    break;
  }
  case DW_FORM_strp: {
    auto SecOffset = AttrValue.Value.getAsSectionOffset();
    assert(SecOffset); // DW_FORM_strp is a section offset.
    if (SecOffset && *SecOffset >= DObj.getStrSection().size()) {
      ++NumErrors;
      error() << "DW_FORM_strp offset beyond .debug_str bounds:\n";
      dump(Die) << '\n';
    }
    break;
  }
  case DW_FORM_strx:
  case DW_FORM_strx1:
  case DW_FORM_strx2:
  case DW_FORM_strx3:
  case DW_FORM_strx4: {
    auto Index = AttrValue.Value.getRawUValue();
    auto DieCU = Die.getDwarfUnit();
    // Check that we have a valid DWARF v5 string offsets table.
    if (!DieCU->getStringOffsetsTableContribution()) {
      ++NumErrors;
      error() << FormEncodingString(Form)
              << " used without a valid string offsets table:\n";
      dump(Die) << '\n';
      break;
    }
    // Check that the index is within the bounds of the section.
    unsigned ItemSize = DieCU->getDwarfStringOffsetsByteSize();
    // Use a 64-bit type to calculate the offset to guard against overflow.
    uint64_t Offset =
        (uint64_t)DieCU->getStringOffsetsBase() + Index * ItemSize;
    if (DObj.getStrOffsetsSection().Data.size() < Offset + ItemSize) {
      ++NumErrors;
      error() << FormEncodingString(Form) << " uses index "
              << format("%" PRIu64, Index) << ", which is too large:\n";
      dump(Die) << '\n';
      break;
    }
    // Check that the string offset is valid.
    uint64_t StringOffset = *DieCU->getStringOffsetSectionItem(Index);
    if (StringOffset >= DObj.getStrSection().size()) {
      ++NumErrors;
      error() << FormEncodingString(Form) << " uses index "
              << format("%" PRIu64, Index)
              << ", but the referenced string"
                 " offset is beyond .debug_str bounds:\n";
      dump(Die) << '\n';
    }
    break;
  }
  default:
    break;
  }
  return NumErrors;
}